

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O0

vector<std::pair<flow::Constant_*,_flow::BasicBlock_*>,_std::allocator<std::pair<flow::Constant_*,_flow::BasicBlock_*>_>_>
* __thiscall
flow::MatchInstr::cases
          (vector<std::pair<flow::Constant_*,_flow::BasicBlock_*>,_std::allocator<std::pair<flow::Constant_*,_flow::BasicBlock_*>_>_>
           *__return_storage_ptr__,MatchInstr *this)

{
  vector<flow::Value_*,_std::allocator<flow::Value_*>_> *this_00;
  size_type sVar1;
  BasicBlock *local_50;
  BasicBlock *code;
  Constant *label;
  size_t i;
  Constant *local_28;
  size_t caseCount;
  MatchInstr *local_18;
  MatchInstr *this_local;
  vector<std::pair<flow::Constant_*,_flow::BasicBlock_*>,_std::allocator<std::pair<flow::Constant_*,_flow::BasicBlock_*>_>_>
  *out;
  
  caseCount._7_1_ = 0;
  local_18 = this;
  this_local = (MatchInstr *)__return_storage_ptr__;
  std::
  vector<std::pair<flow::Constant_*,_flow::BasicBlock_*>,_std::allocator<std::pair<flow::Constant_*,_flow::BasicBlock_*>_>_>
  ::vector(__return_storage_ptr__);
  this_00 = Instr::operands((Instr *)this);
  sVar1 = std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::size(this_00);
  local_28 = (Constant *)(sVar1 - 2 >> 1);
  for (label = (Constant *)0x0; label < local_28;
      label = (Constant *)((long)&(label->super_Value)._vptr_Value + 1)) {
    code = (BasicBlock *)Instr::operand((Instr *)this,(long)label * 2 + 2);
    local_50 = (BasicBlock *)Instr::operand((Instr *)this,(long)label * 2 + 3);
    std::
    vector<std::pair<flow::Constant*,flow::BasicBlock*>,std::allocator<std::pair<flow::Constant*,flow::BasicBlock*>>>
    ::emplace_back<flow::Constant*&,flow::BasicBlock*&>
              ((vector<std::pair<flow::Constant*,flow::BasicBlock*>,std::allocator<std::pair<flow::Constant*,flow::BasicBlock*>>>
                *)__return_storage_ptr__,(Constant **)&code,&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<Constant*, BasicBlock*>> MatchInstr::cases() const {
  std::vector<std::pair<Constant*, BasicBlock*>> out;

  size_t caseCount = (operands().size() - 2) / 2;

  for (size_t i = 0; i < caseCount; ++i) {
    auto label = static_cast<Constant*>(operand(2 + 2 * i + 0));
    auto code = static_cast<BasicBlock*>(operand(2 + 2 * i + 1));

    out.emplace_back(label, code);
  }

  return out;
}